

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O2

void obj_chain(menulist *menu,char *src,obj *chain,long *total_count,long *total_size)

{
  int iVar1;
  nh_menuitem *pnVar2;
  int iVar3;
  long size;
  long count;
  char buf [256];
  
  count = 0;
  size = 0;
  count_obj(chain,&count,&size,'\x01','\0');
  *total_count = *total_count + count;
  *total_size = *total_size + size;
  sprintf(buf,"%-18s %4ld  %6ld",src);
  iVar3 = menu->icount;
  iVar1 = menu->size;
  pnVar2 = menu->items;
  if (iVar1 <= iVar3) {
    menu->size = iVar1 * 2;
    pnVar2 = (nh_menuitem *)realloc(pnVar2,(long)iVar1 * 0x218);
    menu->items = pnVar2;
    iVar3 = menu->icount;
  }
  pnVar2 = pnVar2 + iVar3;
  pnVar2->id = 0;
  pnVar2->role = MI_TEXT;
  pnVar2->accel = '\0';
  pnVar2->group_accel = '\0';
  pnVar2->selected = '\0';
  strcpy(pnVar2->caption,buf);
  menu->icount = menu->icount + 1;
  return;
}

Assistant:

static void obj_chain(struct menulist *menu, const char *src, struct obj *chain,
		      long *total_count, long *total_size)
{
	char buf[BUFSZ];
	long count = 0, size = 0;

	count_obj(chain, &count, &size, TRUE, FALSE);
	*total_count += count;
	*total_size += size;
	sprintf(buf, template, src, count, size);
	add_menutext(menu, buf);
}